

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
EnumerateObjects(HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *this,
                ObjectInfoBits infoBits,_func_void_void_ptr_size_t *CallBackFunction)

{
  undefined6 in_register_00000032;
  anon_class_16_2_d31750c2 fn;
  anon_class_16_2_d31750c2 fn_00;
  
  HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>::
  ForEachAllocator<Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>::UpdateAllocators()::_lambda(Memory::SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>*)_1_>
            ();
  fn.CallBackFunction = CallBackFunction;
  fn._0_8_ = CONCAT62(in_register_00000032,infoBits) & 0xffffffff;
  HeapBlockList::
  ForEach<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucket::EnumerateObjects<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*,Memory::ObjectInfoBits,void(*)(void*,unsigned_long))::_lambda(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (this->fullBlockList,fn);
  fn_00._0_8_ = CONCAT62(in_register_00000032,infoBits) & 0xffffffff;
  fn_00.CallBackFunction = CallBackFunction;
  HeapBlockList::
  ForEach<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucket::EnumerateObjects<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*,Memory::ObjectInfoBits,void(*)(void*,unsigned_long))::_lambda(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (this->heapBlockList,fn_00);
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::EnumerateObjects(ObjectInfoBits infoBits, void (*CallBackFunction)(void * address, size_t size))
{
    UpdateAllocators();
    HeapBucket::EnumerateObjects(fullBlockList, infoBits, CallBackFunction);
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) && !this->IsAnyFinalizableBucket())
    {
        HeapBucket::EnumerateObjects(sweepableHeapBlockList, infoBits, CallBackFunction);
    }
#endif
    HeapBucket::EnumerateObjects(heapBlockList, infoBits, CallBackFunction);
}